

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_not(runtime_type *this,var *b)

{
  bool bVar1;
  bool *pbVar2;
  string *str;
  proxy *in_RDI;
  any *in_stack_00000010;
  any *in_stack_ffffffffffffff90;
  runtime_error *this_00;
  proxy *this_01;
  undefined1 local_41 [40];
  byte local_19;
  
  this_01 = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff90);
  bVar1 = std::type_info::operator==((type_info *)this_01,(type_info *)in_RDI);
  if (!bVar1) {
    str = (string *)__cxa_allocate_exception(0x28);
    this_00 = (runtime_error *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_41 + 1),"Unsupported operator operations(Not).",(allocator *)this_00
              );
    runtime_error::runtime_error(this_00,str);
    __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pbVar2 = cs_impl::any::const_val<bool>(in_stack_00000010);
  local_19 = (*pbVar2 ^ 0xffU) & 1;
  cs_impl::any::any<bool>((any *)this_01,&in_RDI->is_rvalue);
  return (var)this_01;
}

Assistant:

var runtime_type::parse_not(const var &b)
	{
		if (b.type() == typeid(boolean))
			return boolean(!b.const_val<boolean>());
		else
			throw runtime_error("Unsupported operator operations(Not).");
	}